

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineImageTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::ImageTest::getGlslSamplerType_abi_cxx11_
          (string *__return_storage_ptr__,ImageTest *this,TextureFormat *format,VkImageViewType type
          )

{
  TextureChannelClass TVar1;
  ostringstream local_198 [8];
  ostringstream samplerType;
  VkImageViewType type_local;
  TextureFormat *format_local;
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
  if (TVar1 == TEXTURECHANNELCLASS_UNSIGNED_INTEGER) {
    std::operator<<((ostream *)local_198,"u");
  }
  else {
    TVar1 = tcu::getTextureChannelClass(*(ChannelType *)(this + 4));
    if (TVar1 == TEXTURECHANNELCLASS_SIGNED_INTEGER) {
      std::operator<<((ostream *)local_198,"i");
    }
  }
  switch((ulong)format & 0xffffffff) {
  case 0:
    std::operator<<((ostream *)local_198,"sampler1D");
    break;
  case 1:
    std::operator<<((ostream *)local_198,"sampler2D");
    break;
  case 2:
    std::operator<<((ostream *)local_198,"sampler3D");
    break;
  case 3:
    std::operator<<((ostream *)local_198,"samplerCube");
    break;
  case 4:
    std::operator<<((ostream *)local_198,"sampler1DArray");
    break;
  case 5:
    std::operator<<((ostream *)local_198,"sampler2DArray");
    break;
  case 6:
    std::operator<<((ostream *)local_198,"samplerCubeArray");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return __return_storage_ptr__;
}

Assistant:

std::string ImageTest::getGlslSamplerType (const tcu::TextureFormat& format, VkImageViewType type)
{
	std::ostringstream samplerType;

	if (tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER)
		samplerType << "u";
	else if (tcu::getTextureChannelClass(format.type) == tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER)
		samplerType << "i";

	switch (type)
	{
		case VK_IMAGE_VIEW_TYPE_1D:
			samplerType << "sampler1D";
			break;

		case VK_IMAGE_VIEW_TYPE_1D_ARRAY:
			samplerType << "sampler1DArray";
			break;

		case VK_IMAGE_VIEW_TYPE_2D:
			samplerType << "sampler2D";
			break;

		case VK_IMAGE_VIEW_TYPE_2D_ARRAY:
			samplerType << "sampler2DArray";
			break;

		case VK_IMAGE_VIEW_TYPE_3D:
			samplerType << "sampler3D";
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE:
			samplerType << "samplerCube";
			break;

		case VK_IMAGE_VIEW_TYPE_CUBE_ARRAY:
			samplerType << "samplerCubeArray";
			break;

		default:
			DE_FATAL("Unknown image view type");
			break;
	}

	return samplerType.str();
}